

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.c
# Opt level: O3

ZyanStatus
ZyanVectorBinarySearchEx
          (ZyanVector *vector,void *element,ZyanUSize *found_index,ZyanComparison comparison,
          ZyanUSize index,ZyanUSize count)

{
  ZyanUSize ZVar1;
  ZyanI32 ZVar2;
  ZyanStatus ZVar3;
  ZyanStatus ZVar4;
  long lVar5;
  long lVar6;
  
  if (vector == (ZyanVector *)0x0) {
    ZVar4 = 0x80100004;
  }
  else {
    ZVar4 = 0x80100008;
    if ((count == 0 || index < vector->size) && (count + index <= vector->size)) {
      ZVar4 = 0x100003;
      if (count != 0) {
        if (vector->element_size == 0) {
          __assert_fail("vector->element_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/dependencies/zycore/src/Vector.c"
                        ,0x2cc,
                        "ZyanStatus ZyanVectorBinarySearchEx(const ZyanVector *, const void *, ZyanUSize *, ZyanComparison, ZyanUSize, ZyanUSize)"
                       );
        }
        if (vector->data == (void *)0x0) {
          __assert_fail("vector->data",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/dependencies/zycore/src/Vector.c"
                        ,0x2cd,
                        "ZyanStatus ZyanVectorBinarySearchEx(const ZyanVector *, const void *, ZyanUSize *, ZyanComparison, ZyanUSize, ZyanUSize)"
                       );
        }
        lVar6 = (count + index) - 1;
        if ((long)index <= lVar6) {
          do {
            lVar5 = (long)(lVar6 - index) >> 1;
            ZVar2 = (*comparison)((void *)((lVar5 + index) * vector->element_size +
                                          (long)vector->data),element);
            ZVar3 = ZVar4;
            if (ZVar2 == 0) {
              ZVar3 = 0x100002;
            }
            ZVar1 = lVar5 + 1 + index;
            if (-1 < ZVar2) {
              ZVar4 = ZVar3;
              ZVar1 = index;
              lVar6 = lVar5 + -1 + index;
            }
            index = ZVar1;
          } while ((long)index <= lVar6);
        }
      }
      *found_index = index;
    }
  }
  return ZVar4;
}

Assistant:

ZyanStatus ZyanVectorBinarySearchEx(const ZyanVector* vector, const void* element,
    ZyanUSize* found_index, ZyanComparison comparison, ZyanUSize index, ZyanUSize count)
{
    if (!vector)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }
    if (((index >= vector->size) && (count > 0)) || (index + count > vector->size))
    {
        return ZYAN_STATUS_OUT_OF_RANGE;
    }

    if (!count)
    {
        *found_index = index;
        return ZYAN_STATUS_FALSE;
    }

    ZYAN_ASSERT(vector->element_size);
    ZYAN_ASSERT(vector->data);

    ZyanStatus status = ZYAN_STATUS_FALSE;
    ZyanISize l = index;
    ZyanISize h = index + count - 1;
    while (l <= h)
    {
        const ZyanUSize mid = l + ((h - l) >> 1);
        const ZyanI32 cmp = comparison(ZYCORE_VECTOR_OFFSET(vector, mid), element);
        if (cmp < 0)
        {
            l = mid + 1;
        } else
        {
            h = mid - 1;
            if (cmp == 0)
            {
                status = ZYAN_STATUS_TRUE;
            }
        }
    }

    *found_index = l;
    return status;
}